

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void dump_dfg_gml(EVdfg_configuration state)

{
  FILE *__s;
  ulong in_RAX;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  __s = _stdout;
  fputs("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<!-- This file was written by the JAVA GraphML Library.-->\n<graphml\n xmlns=\"http://graphml.graphdrawing.org/xmlns\"\n xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\"\n xmlns:y=\"http://www.yworks.com/xml/graphml\"\n xmlns:yed=\"http://www.yworks.com/xml/yed/3\"\n xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://www.yworks.com/xml/schema/graphml/1.1/ygraphml.xsd\">\n  <key id=\"d0\" for=\"node\" attr.name=\"color\" attr.type=\"string\">\n    <default>yellow</default>\n  </key>\n  <key for=\"node\" id=\"d1\" yfiles.type=\"nodegraphics\"/>\n  <graph id=\"G\" edgedefault=\"directed\">\n"
        ,_stdout);
  for (uVar1 = 0; (long)uVar1 < (long)state->stone_count; uVar1 = uVar1 + 1) {
    fprintf(__s,"<node id=\"n%d\" name=\"stone%d\">\n",uVar1 & 0xffffffff,uVar1 & 0xffffffff);
    for (uVar2 = 0; (int)uVar2 < state->stones[uVar1]->out_count; uVar2 = uVar2 + 1) {
      fprintf(__s,"<port name=\"P%d\"/>\n",(ulong)uVar2);
    }
    fprintf(__s,
            "      <data key=\"d1\">\n        <y:ShapeNode>\n            <y:NodeLabel>S%d</y:NodeLabel>                    <!-- label text -->\n        </y:ShapeNode>\n      </data>\n"
            ,uVar1 & 0xffffffff);
    fwrite("</node>\n",8,1,__s);
    for (uVar3 = 0; (long)uVar3 < (long)state->stones[uVar1]->out_count; uVar3 = uVar3 + 1) {
      uVar2 = state->stones[uVar1]->out_links[uVar3];
      in_RAX = CONCAT44((int)(in_RAX >> 0x20),uVar2) & 0xffffffff7fffffff;
      fprintf(__s,"<edge id=\"n%de%d\" source=\"n%d\" sourceport=\"P%d\" target=\"n%d\">\n",
              uVar1 & 0xffffffff,(ulong)(uVar2 & 0x7fffffff),uVar1 & 0xffffffff,uVar3 & 0xffffffff,
              in_RAX);
      fwrite("</edge>\n",8,1,__s);
    }
  }
  fwrite("</graph>\n</graphml>\n",0x14,1,__s);
  return;
}

Assistant:

static void
dump_dfg_gml(EVdfg_configuration state)
{
    fdump_dfg_gml(stdout, state);
}